

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O3

void __thiscall CNetTokenManager::GenerateSeed(CNetTokenManager *this)

{
  TOKEN TVar1;
  int64 iVar2;
  int64 iVar3;
  
  this->m_PrevSeed = this->m_Seed;
  secure_random_fill(&this->m_Seed,8);
  this->m_PrevGlobalToken = this->m_GlobalToken;
  TVar1 = GenerateToken(&GenerateSeed::NullAddr,this->m_Seed);
  this->m_GlobalToken = TVar1;
  iVar2 = time_get();
  iVar3 = time_freq();
  this->m_NextSeedTime = this->m_SeedTime * iVar3 + iVar2;
  return;
}

Assistant:

void CNetTokenManager::GenerateSeed()
{
	static const NETADDR NullAddr = { 0 };
	m_PrevSeed = m_Seed;

	secure_random_fill(&m_Seed, sizeof(m_Seed));

	m_PrevGlobalToken = m_GlobalToken;
	m_GlobalToken = GenerateToken(&NullAddr);

	m_NextSeedTime = time_get() + time_freq() * m_SeedTime;
}